

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict.cpp
# Opt level: O2

int __thiscall SAT::findConflictLevel(SAT *this)

{
  Clause **elem;
  int iVar1;
  uint uVar2;
  Clause *ps;
  Lit *pLVar3;
  Clause *this_00;
  int tp;
  size_t __size;
  uint i;
  uint uVar4;
  
  elem = &this->confl;
  tp = -1;
  uVar4 = 0;
  while( true ) {
    if (*(uint *)*elem >> 8 <= uVar4) break;
    pLVar3 = Clause::operator[](*elem,uVar4);
    iVar1 = (this->trailpos).data[(uint)(pLVar3->x >> 1)];
    if (tp < iVar1) {
      tp = iVar1;
    }
    uVar4 = uVar4 + 1;
  }
  uVar4 = Engine::tpToLevel(&engine,tp);
  if ((uVar4 == 0) && (so.sym_static != false)) {
    btToLevel(this,0);
    engine.async_fail = true;
    fprintf(_stderr,"%s:%d: ","conflict.cpp",0x18d);
    fwrite("Not yet supported\n",0x12,1,_stderr);
    abort();
  }
  if ((int)uVar4 < (int)((this->trail).sz - 1)) {
    ps = *elem;
    uVar2 = *(uint *)ps;
    if ((uVar2 & 2) != 0) {
      __size = 8;
      if (0xff < uVar2) {
        __size = (ulong)((uVar2 >> 8) - 1) * 4 + 8;
      }
      this_00 = (Clause *)malloc(__size);
      Clause::Clause<Clause>(this_00,ps,false);
      this->confl = this_00;
      *(byte *)this_00 = *(byte *)this_00 | 2;
      vec<Clause_*>::push((this->rtrail).data + uVar4,elem);
    }
  }
  btToLevel(this,uVar4);
  return uVar4;
}

Assistant:

int SAT::findConflictLevel() {
	int tp = -1;
	for (unsigned int i = 0; i < confl->size(); i++) {
		const int l = trailpos[var((*confl)[i])];
		if (l > tp) {
			tp = l;
		}
	}
	const int clevel = engine.tpToLevel(tp);

	if (so.sym_static && clevel == 0) {
		btToLevel(0);
		engine.async_fail = true;
		NOT_SUPPORTED;
		// need to abort analyze as well
		return 0;
	}
	assert(clevel > 0);

	// duplicate conflict clause in case it gets freed
	if (clevel < decisionLevel() && confl->temp_expl) {
		confl = Clause_new(*confl);
		confl->temp_expl = 1;
		rtrail[clevel].push(confl);
	}
	btToLevel(clevel);

	//	fprintf(stderr, "clevel = %d\n", clevel);

	if (PRINT_ANALYSIS) {
		printf("Conflict: level = %d\n", clevel);
	}

	return clevel;
}